

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,ImputedData<long,double>>,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::
insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
          (robin_hash<std::pair<unsigned_long,ImputedData<long,double>>,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,ImputedData<long,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,ImputedData<long,double>>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,unsigned_long *key,piecewise_construct_t *value_type_args,
          tuple<const_unsigned_long_&> *value_type_args_1,tuple<> *value_type_args_2)

{
  ulong uVar1;
  bool bVar2;
  distance_type *pdVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  size_t ibucket;
  ulong uVar5;
  distance_type curr_dist_from_ideal_bucket;
  robin_iterator<false> rVar6;
  long lVar7;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar8;
  
  uVar1 = *key;
  curr_dist_from_ideal_bucket = 0;
  uVar5 = uVar1;
  do {
    ibucket = uVar5 & *(ulong *)this;
    if (*(short *)(*(long *)(this + 0x20) + ibucket * 0x100) < curr_dist_from_ideal_bucket) {
      while (bVar2 = robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::rehash_on_extreme_load
                               ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,curr_dist_from_ideal_bucket), bVar2) {
        uVar5 = uVar1;
        for (curr_dist_from_ideal_bucket = 0; ibucket = uVar5 & *(ulong *)this,
            curr_dist_from_ideal_bucket <= *(short *)(*(long *)(this + 0x20) + ibucket * 0x100);
            curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1) {
          uVar5 = ibucket + 1;
        }
      }
      lVar7 = ibucket * 0x100;
      if (*(short *)(*(long *)(this + 0x20) + lVar7) == -1) {
        pdVar3 = (distance_type *)(*(long *)(this + 0x20) + lVar7);
        *(unsigned_long *)(pdVar3 + 4) =
             *(value_type_args_1->super__Tuple_impl<0UL,_const_unsigned_long_&>).
              super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl;
        memset(pdVar3 + 8,0,0xd8);
        *pdVar3 = curr_dist_from_ideal_bucket;
        uVar4 = extraout_RDX_00;
      }
      else {
        insert_value<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                  (this,ibucket,curr_dist_from_ideal_bucket,(truncated_hash_type)uVar1,
                   value_type_args,value_type_args_1,value_type_args_2);
        uVar4 = extraout_RDX;
      }
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      rVar6.m_bucket = (bucket_entry_ptr)(lVar7 + *(long *)(this + 0x20));
      uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
LAB_001c3e9f:
      pVar8._8_8_ = uVar4;
      pVar8.first.m_bucket = rVar6.m_bucket;
      return pVar8;
    }
    rVar6.m_bucket = (bucket_entry_ptr)(ibucket * 0x100 + *(long *)(this + 0x20));
    if (*(ulong *)(rVar6.m_bucket)->m_value == uVar1) {
      uVar4 = 0;
      goto LAB_001c3e9f;
    }
    uVar5 = ibucket + 1;
    curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }